

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int jitopt_flag(jit_State *J,char *str)

{
  bool bVar1;
  int iVar2;
  ulong __n;
  size_t len;
  int set;
  uint32_t opt;
  char *lst;
  char *str_local;
  jit_State *J_local;
  
  _set = "\x04fold\x03cse\x03dce\x03fwd\x03dse\x06narrow\x04loop\x03abc\x04sink\x04fuse";
  bVar1 = true;
  if (*str == '+') {
    lst = str + 1;
  }
  else if (*str == '-') {
    lst = str + 1;
    bVar1 = false;
  }
  else {
    lst = str;
    if ((*str == 'n') && (str[1] == 'o')) {
      iVar2 = 2;
      if (str[2] == '-') {
        iVar2 = 3;
      }
      lst = str + iVar2;
      bVar1 = false;
    }
  }
  len._4_4_ = 0x10000;
  while( true ) {
    __n = (ulong)(byte)*_set;
    if (__n == 0) {
      return 0;
    }
    iVar2 = strncmp(lst,(char *)((byte *)_set + 1),__n);
    if ((iVar2 == 0) && (lst[__n] == '\0')) break;
    _set = (char *)((byte *)_set + __n + 1);
    len._4_4_ = len._4_4_ << 1;
  }
  if (bVar1) {
    J->flags = len._4_4_ | J->flags;
  }
  else {
    J->flags = (len._4_4_ ^ 0xffffffff) & J->flags;
  }
  return 1;
}

Assistant:

static int jitopt_flag(jit_State *J, const char *str)
{
  const char *lst = JIT_F_OPTSTRING;
  uint32_t opt;
  int set = 1;
  if (str[0] == '+') {
    str++;
  } else if (str[0] == '-') {
    str++;
    set = 0;
  } else if (str[0] == 'n' && str[1] == 'o') {
    str += str[2] == '-' ? 3 : 2;
    set = 0;
  }
  for (opt = JIT_F_OPT; ; opt <<= 1) {
    size_t len = *(const uint8_t *)lst;
    if (len == 0)
      break;
    if (strncmp(str, lst+1, len) == 0 && str[len] == '\0') {
      if (set) J->flags |= opt; else J->flags &= ~opt;
      return 1;  /* Ok. */
    }
    lst += 1+len;
  }
  return 0;  /* No match. */
}